

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O3

void __thiscall
CaDiCaL::LratChecker::weaken_minus
          (LratChecker *this,uint64_t id,vector<int,_std::allocator<int>_> *c)

{
  uint uVar1;
  LratCheckerClause *pLVar2;
  uint *puVar3;
  pointer piVar4;
  long lVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  int *lit;
  LratCheckerClause **ppLVar9;
  uint *puVar10;
  mapped_type *this_00;
  ulong uVar11;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> e;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  uint64_t local_38;
  
  local_38 = id;
  import_clause(this,c);
  this->last_id = id;
  ppLVar9 = find(this,id);
  pLVar2 = *ppLVar9;
  if (pLVar2 == (LratCheckerClause *)0x0) {
    weaken_minus(this);
  }
  else {
    puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar10 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      uVar8 = *puVar10;
      uVar1 = -uVar8;
      if (0 < (int)uVar8) {
        uVar1 = uVar8;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[~(~uVar8 >> 0x1f) + uVar1 * 2] = '\x01';
    }
    uVar8 = pLVar2->size;
    local_40 = c;
    if (uVar8 != 0) {
      uVar11 = 0;
      do {
        uVar1 = pLVar2->literals[uVar11];
        uVar6 = -uVar1;
        if (0 < (int)uVar1) {
          uVar6 = uVar1;
        }
        if ((this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[~(~uVar1 >> 0x1f) + uVar6 * 2] == '\0') {
          weaken_minus();
          uVar8 = (uint)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar8);
    }
    puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar10 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; c = local_40, puVar10 != puVar3
        ; puVar10 = puVar10 + 1) {
      uVar8 = *puVar10;
      uVar1 = -uVar8;
      if (0 < (int)uVar8) {
        uVar1 = uVar8;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[~(~uVar8 >> 0x1f) + uVar1 * 2] = '\0';
    }
  }
  piVar4 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_58,c);
  piVar4 = (pointer)CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (uint)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  if (piVar4 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar4,local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar4,local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  this_00 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->clauses_to_reconstruct,&local_38);
  std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_58);
  pvVar7 = (void *)CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
  }
  return;
}

Assistant:

void LratChecker::weaken_minus (uint64_t id, const vector<int> &c) {
  LOG (c, "LRAT CHECKER saving clause[%" PRIu64 "] to restore later", id);
  import_clause (c);

  assert (id <= current_id);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;
  } else {
    fatal_message_start ();
    fputs ("weakened clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();

  vector<int> e = c;
  sort (begin (e), end (e));
  clauses_to_reconstruct[id] = e;
}